

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeanLoader.h
# Opt level: O2

void __thiscall
hiberlite::LoadBean::act<hiberlite::AVisitor<hiberlite::LoadBean>,std::__cxx11::string>
          (LoadBean *this,AVisitor<hiberlite::LoadBean> *av,
          db_atom<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *atom)

{
  int iVar1;
  _Elt_pointer ppVar2;
  int col_indx;
  int local_84;
  string local_80;
  undefined1 local_60 [72];
  
  Scope::Scope((Scope *)local_60,&av->scope);
  std::__cxx11::string::string((string *)&local_80,(string *)(local_60 + 0x20));
  iVar1 = locateCol(this,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  Scope::~Scope((Scope *)local_60);
  ppVar2 = (this->stmt).c.
           super__Deque_base<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVar2 == (this->stmt).c.
                super__Deque_base<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppVar2 = (this->stmt).c.
             super__Deque_base<std::pair<hiberlite::SQLiteSelect,_long_long>,_std::allocator<std::pair<hiberlite::SQLiteSelect,_long_long>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 9;
  }
  local_84 = iVar1;
  db_atom<std::__cxx11::string>::loadValue<hiberlite::SQLiteSelect,int>
            ((db_atom<std::__cxx11::string> *)atom,&ppVar2[-1].first,&local_84);
  return;
}

Assistant:

inline void act(AV& av, db_atom<C> atom){
			int col_indx=locateCol(av.getScope().prefix());
			atom.loadValue(stmt.top().first, col_indx);
		}